

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O1

void __thiscall
jsoncons::jsonpath::detail::
static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
static_resources(static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *this,custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       *functions,allocator_type *alloc)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::MyHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>_>
  *puVar1;
  undefined1 uVar2;
  pointer pcVar3;
  _Manager_type p_Var4;
  long *plVar5;
  function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_std::error_code_&)>
  *__x;
  pointer pcVar6;
  long *local_40;
  static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_38;
  
  local_38 = this;
  static_resources(this,alloc);
  pcVar6 = (functions->functions_).
           super__Vector_base<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (functions->functions_).
           super__Vector_base<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar6 != pcVar3) {
    puVar1 = &local_38->custom_functions_;
    __x = &pcVar6->f_;
    do {
      p_Var4 = __x[-1].super__Function_base._M_manager;
      uVar2 = *(undefined1 *)&__x[-1]._M_invoker;
      plVar5 = (long *)operator_new(0x38);
      plVar5[1] = (long)p_Var4;
      *(undefined1 *)(plVar5 + 2) = uVar2;
      *plVar5 = (long)&PTR__decorator_function_00b61da0;
      std::
      function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_std::error_code_&)>
      ::function((function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_std::error_code_&)>
                  *)(plVar5 + 3),__x);
      local_40 = plVar5;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::__cxx11::string_const&,std::unique_ptr<jsoncons::jsonpath::detail::decorator_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::decorator_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)puVar1,&__x[-2].super__Function_base._M_manager,&local_40);
      if (local_40 != (long *)0x0) {
        (**(code **)(*local_40 + 8))();
      }
      pcVar6 = (pointer)(__x + 1);
      __x = (function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_std::error_code_&)>
             *)&__x[2].super__Function_base._M_manager;
    } while (pcVar6 != pcVar3);
  }
  return;
}

Assistant:

static_resources(const custom_functions<Json>& functions, 
            const allocator_type& alloc = allocator_type())
            : static_resources(alloc)
        {
            for (const auto& item : functions)
            {
                custom_functions_.emplace(item.name(),
                                          jsoncons::make_unique<decorator_function<Json>>(item.arity(),item.function()));
            }
        }